

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O3

void absl::lts_20250127::cord_internal::LogFatalNodeType(CordRep *rep)

{
  char *buffer;
  Nonnull<char_*> pcVar1;
  AlphaNum *in_RCX;
  string local_90;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  local_40 = 0x16;
  local_38 = "Unexpected node type: ";
  buffer = local_70.digits_;
  pcVar1 = numbers_internal::FastIntToBuffer((uint)rep->tag,buffer);
  local_70.piece_._M_len = (long)pcVar1 - (long)buffer;
  local_70.piece_._M_str = buffer;
  StrCat_abi_cxx11_(&local_90,(lts_20250127 *)&local_40,&local_70,in_RCX);
  (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
            (3,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.cc"
             ,0x24,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.cc"
                ,0x24,"void absl::cord_internal::LogFatalNodeType(CordRep *)");
}

Assistant:

void LogFatalNodeType(CordRep* rep) {
  ABSL_INTERNAL_LOG(FATAL, absl::StrCat("Unexpected node type: ",
                                        static_cast<int>(rep->tag)));
}